

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8LBitReaderSetBuffer(VP8LBitReader *br,uint8_t *buf,size_t len)

{
  int iVar1;
  
  br->buf = buf;
  br->len = len;
  if (len < br->pos) {
    iVar1 = 1;
  }
  else {
    iVar1 = VP8LIsEndOfStream(br);
  }
  br->eos = iVar1;
  return;
}

Assistant:

void VP8LBitReaderSetBuffer(VP8LBitReader* const br,
                            const uint8_t* const buf, size_t len) {
  assert(br != NULL);
  assert(buf != NULL);
  assert(len < 0xfffffff8u);   // can't happen with a RIFF chunk.
  br->buf = buf;
  br->len = len;
  // 'pos' > 'len' should be considered a param error.
  br->eos = (br->pos > br->len) || VP8LIsEndOfStream(br);
}